

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O0

void __thiscall
adios2::helper::CommImplDummy::Allgatherv
          (CommImplDummy *this,void *sendbuf,size_t sendcount,Datatype sendtype,void *recvbuf,
          size_t *recvcounts,size_t *displs,Datatype recvtype,string *hint)

{
  long in_RDX;
  long *in_R9;
  string *in_stack_00000040;
  size_t in_stack_00000058;
  size_t recvcount;
  undefined4 in_stack_00000078;
  int in_stack_00000098;
  allocator local_59;
  string local_58 [32];
  long local_38;
  
  local_38 = *in_R9;
  if (local_38 == in_RDX) {
    Gather((CommImplDummy *)sendcount,(void *)CONCAT44(sendtype,in_stack_00000078),(size_t)recvbuf,
           recvcounts._4_4_,(void *)recvcount,in_stack_00000058,(Datatype)this,in_stack_00000098,
           (string *)displs);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"send and recv counts differ",&local_59);
    anon_unknown_8::CommDummyError(in_stack_00000040);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return;
}

Assistant:

void CommImplDummy::Allgatherv(const void *sendbuf, size_t sendcount, Datatype sendtype,
                               void *recvbuf, const size_t *recvcounts, const size_t *displs,
                               Datatype recvtype, const std::string &hint) const
{
    const size_t recvcount = recvcounts[0];
    if (recvcount != sendcount)
    {
        return CommDummyError("send and recv counts differ");
    }
    CommImplDummy::Gather(sendbuf, sendcount, sendtype, recvbuf, recvcount, recvtype, 0, hint);
}